

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O3

void rmoldest(logdir *ld)

{
  char *s;
  uint uVar1;
  int iVar2;
  int iVar3;
  DIR *__dirp;
  int *piVar4;
  dirent *pdVar5;
  ulong uVar6;
  char oldest [30];
  undefined2 local_58 [13];
  undefined1 local_3d;
  
  local_58[0] = 0x41;
  local_3d = 0;
  __dirp = opendir(".");
  while (__dirp == (DIR *)0x0) {
    strerr_warn("svlogd: pausing: ","unable to open directory, want rotate",": ",ld->name,": ",
                (char *)0x0,&strerr_sys);
    sleep(3);
    __dirp = opendir(".");
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  pdVar5 = readdir(__dirp);
  uVar6 = 0;
  if (pdVar5 != (dirent *)0x0) {
    iVar3 = 0;
    do {
      if (pdVar5->d_name[0] == '@') {
        s = pdVar5->d_name;
        uVar1 = str_len(s);
        if (uVar1 == 0x1b) {
          if (pdVar5->d_name[0x1a] == 't') {
            iVar2 = unlink(s);
            if (iVar2 == -1) {
              strerr_warn("svlogd: warning: ","unable to unlink processor leftover",": ",s,": ",
                          (char *)0x0,&strerr_sys);
            }
          }
          else {
            iVar3 = iVar3 + 1;
            iVar2 = str_diff(s,(char *)local_58);
            if (iVar2 < 0) {
              byte_copy((char *)local_58,0x1b,s);
            }
          }
          *piVar4 = 0;
        }
      }
      pdVar5 = readdir(__dirp);
    } while (pdVar5 != (dirent *)0x0);
    uVar6 = (ulong)iVar3;
  }
  if (*piVar4 != 0) {
    strerr_warn("svlogd: warning: ","unable to read directory",": ",ld->name,": ",(char *)0x0,
                &strerr_sys);
  }
  closedir(__dirp);
  if ((ld->nmax != 0) && (ld->nmax < uVar6)) {
    if (verbose != 0) {
      strerr_warn("svlogd: info: ","delete: ",ld->name,"/",(char *)local_58,(char *)0x0,
                  (strerr *)0x0);
    }
    if (((char)local_58[0] == '@') && (iVar3 = unlink((char *)local_58), iVar3 == -1)) {
      strerr_warn("svlogd: warning: ","unable to unlink oldest logfile",": ",ld->name,": ",
                  (char *)0x0,&strerr_sys);
    }
  }
  return;
}

Assistant:

void rmoldest(struct logdir *ld) {
  DIR *d;
  direntry *f;
  char oldest[FMT_PTIME];
  int n =0;

  oldest[0] ='A'; oldest[1] =oldest[27] =0;
  while (! (d =opendir(".")))
    pause2("unable to open directory, want rotate", ld->name);
  errno =0;
  while ((f =readdir(d)))
    if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
      if (f->d_name[26] == 't') {
        if (unlink(f->d_name) == -1)
          warn2("unable to unlink processor leftover", f->d_name);
      }
      else {
        ++n;
        if (str_diff(f->d_name, oldest) < 0) byte_copy(oldest, 27, f->d_name);
      }
      errno =0;
    }
  if (errno) warn2("unable to read directory", ld->name);
  closedir(d);

  if (ld->nmax && (n > ld->nmax)) {
    if (verbose) strerr_warn5(INFO, "delete: ", ld->name, "/", oldest, 0);
    if ((*oldest == '@') && (unlink(oldest) == -1))
      warn2("unable to unlink oldest logfile", ld->name);
  }
}